

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

_Bool testbufferedxor8(size_t size)

{
  _Bool _Var1;
  uint64_t *keys;
  clock_t cVar2;
  clock_t cVar3;
  uint32_t size_00;
  long lVar4;
  size_t i;
  uint64_t uVar5;
  bool bVar6;
  xor8_t filter;
  
  printf("testing buffered xor8 ");
  printf("size = %zu \n",size);
  size_00 = (uint32_t)size;
  xor8_allocate(size_00,&filter);
  keys = (uint64_t *)malloc(size * 8);
  for (uVar5 = 0; size != uVar5; uVar5 = uVar5 + 1) {
    keys[uVar5] = uVar5;
  }
  _Var1 = xor8_buffered_populate(keys,size_00,&filter);
  if (_Var1) {
    lVar4 = 5;
    while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
      cVar2 = clock();
      xor8_buffered_populate(keys,size_00,&filter);
      cVar3 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar3 - cVar2) / 1000000.0,size);
    }
    xor8_free(&filter);
    free(keys);
  }
  return _Var1;
}

Assistant:

bool testbufferedxor8(size_t size) {
  printf("testing buffered xor8 ");
  printf("size = %zu \n", size);

  xor8_t filter;
  xor8_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = xor8_buffered_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    xor8_buffered_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  xor8_free(&filter);
  free(big_set);
  return true;
}